

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_1224d25::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  char *pcVar4;
  cmMakefile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string_view value;
  allocator<char> local_51;
  string e;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"sub-command COMPARE requires a mode to be specified.",&local_51);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00392ff6:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  __lhs_00 = pbVar1 + 1;
  bVar2 = std::operator==(__lhs_00,"EQUAL");
  if ((((!bVar2) && (bVar2 = std::operator==(__lhs_00,"NOTEQUAL"), !bVar2)) &&
      (bVar2 = std::operator==(__lhs_00,"LESS"), !bVar2)) &&
     (((bVar2 = std::operator==(__lhs_00,"LESS_EQUAL"), !bVar2 &&
       (bVar2 = std::operator==(__lhs_00,"GREATER"), !bVar2)) &&
      (bVar2 = std::operator==(__lhs_00,"GREATER_EQUAL"), !bVar2)))) {
    std::operator+(&e,"sub-command COMPARE does not recognize mode ",__lhs_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00392ff6;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x81) {
    cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[46]>
              (&e,(char (*) [27])"sub-command COMPARE, mode ",__lhs_00,(char (*) [46])0x74d762);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00392ff6;
  }
  __lhs = pbVar1 + 2;
  __rhs = pbVar1 + 3;
  bVar2 = std::operator==(__lhs_00,"LESS");
  if (bVar2) {
    bVar2 = std::operator<(__lhs,__rhs);
LAB_00393091:
    if (bVar2 != false) {
LAB_00393095:
      this = status->Makefile;
      pcVar4 = "1";
      goto LAB_003930cc;
    }
  }
  else {
    bVar2 = std::operator==(__lhs_00,"LESS_EQUAL");
    if (bVar2) {
      bVar2 = std::operator<=(__lhs,__rhs);
      goto LAB_00393091;
    }
    bVar2 = std::operator==(__lhs_00,"GREATER");
    if (bVar2) {
      bVar2 = std::operator>(__lhs,__rhs);
      goto LAB_00393091;
    }
    bVar2 = std::operator==(__lhs_00,"GREATER_EQUAL");
    if (bVar2) {
      bVar2 = std::operator>=(__lhs,__rhs);
      goto LAB_00393091;
    }
    bVar2 = std::operator==(__lhs_00,"EQUAL");
    _Var3 = std::operator==(__lhs,__rhs);
    if (bVar2 == _Var3) goto LAB_00393095;
  }
  this = status->Makefile;
  pcVar4 = "0";
LAB_003930cc:
  value._M_str = pcVar4;
  value._M_len = 1;
  cmMakefile::AddDefinition(this,pbVar1 + 4,value);
  return true;
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e =
        cmStrCat("sub-command COMPARE, mode ", mode,
                 " needs at least 5 arguments total to command.");
      status.SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      status.GetMakefile().AddDefinition(outvar, "1");
    } else {
      status.GetMakefile().AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  status.SetError(e);
  return false;
}